

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

bool google::protobuf::internal::anon_unknown_36::TreatEnumAsInt(FieldDescriptor *field)

{
  bool bVar1;
  EnumDescriptor *pEVar2;
  Descriptor *pDVar3;
  FieldDescriptor *pFVar4;
  undefined1 local_12;
  undefined1 local_11;
  FieldDescriptor *field_local;
  
  bVar1 = cpp::HasPreservingUnknownEnumSemantics(field);
  local_11 = true;
  if (!bVar1) {
    pEVar2 = FieldDescriptor::enum_type(field);
    local_12 = false;
    if (pEVar2 != (EnumDescriptor *)0x0) {
      pDVar3 = FieldDescriptor::containing_type(field);
      local_12 = false;
      if (pDVar3 != (Descriptor *)0x0) {
        pDVar3 = FieldDescriptor::containing_type(field);
        pFVar4 = Descriptor::map_value(pDVar3);
        local_12 = pFVar4 == field;
      }
    }
    local_11 = local_12;
  }
  return local_11;
}

Assistant:

bool TreatEnumAsInt(const FieldDescriptor* field) {
  return cpp::HasPreservingUnknownEnumSemantics(field) ||
         // For legacy reasons, MapEntry mapped_type enum fields are handled as
         // open always. The validation happens elsewhere.
         (field->enum_type() != nullptr &&
          field->containing_type() != nullptr &&
          field->containing_type()->map_value() == field);
}